

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFComment.cpp
# Opt level: O0

void __thiscall PDFComment::PDFComment(PDFComment *this)

{
  PDFComment *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->CommentatorName);
  CMYKRGBColor::CMYKRGBColor(&this->Color);
  PDFDate::PDFDate(&this->Time);
  PDFDate::SetToCurrentTime(&this->Time);
  this->ReplyTo = (PDFComment *)0x0;
  this->FrameBoundings[3] = 0.0;
  this->FrameBoundings[2] = 0.0;
  this->FrameBoundings[1] = 0.0;
  this->FrameBoundings[0] = 0.0;
  return;
}

Assistant:

PDFComment::PDFComment(void)
{
	Time.SetToCurrentTime();
	ReplyTo = NULL;
	FrameBoundings[0] = FrameBoundings[1] = FrameBoundings[2] = FrameBoundings[3] = 0.0;
}